

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

bool __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_node
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          *node_queue,uint *end_node,task_pool *pTask_pool)

{
  uint uVar1;
  uint uVar2;
  pointer pNVar3;
  vq_node *pvVar4;
  vq_node *pvVar5;
  vec<6U,_float> *pvVar6;
  VectorInfo *pVVar7;
  vec<6U,_float> *pvVar8;
  vq_node *pvVar9;
  undefined1 auVar10 [16];
  double dVar11;
  int iVar12;
  int iVar13;
  undefined8 uVar14;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  *this_00;
  bool bVar15;
  uint i_4;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  executable_task *pObj;
  ulong uVar19;
  long lVar20;
  long lVar21;
  value_type *pvVar22;
  uint task;
  uint64 uVar23;
  uint uVar24;
  value_type *pvVar25;
  ulong uVar26;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *pvVar27;
  uint i_2;
  undefined8 *puVar28;
  uint i_8;
  uint x;
  uint uVar29;
  long lVar30;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *pvVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  float dist2;
  float fVar35;
  float fVar36;
  float dist2_2;
  float fVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double sum;
  float fVar41;
  vec<6U,_float> axis;
  vec<6U,_float> new_left_child;
  vec<6U,_float> right_child;
  vec<6U,_float> left_child;
  vec<6U,_float> result_6;
  vec<6U,_float> furthest;
  vec<6U,_float> new_right_child;
  vec<6U,_float> result;
  vec<6U,_float> opposite;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8 [2];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8 [2];
  float local_1b4;
  task_pool *local_1b0;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *local_1a8;
  int local_19c;
  undefined1 local_198 [40];
  float afStack_170 [6];
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *local_158;
  float local_150 [6];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  uint *local_118;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  *local_110;
  float local_108 [8];
  undefined1 local_e8 [16];
  value_type local_d8;
  undefined1 *local_d0;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  pNVar3 = (node_queue->c).
           super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar3 != (node_queue->c).
                super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uVar1 = pNVar3->m_index;
    pvVar4 = (this->m_nodes).m_p;
    if (pvVar4[uVar1].m_alternative == true) {
      pvVar4[uVar1].m_alternative = false;
    }
    if ((0.0 < pvVar4[uVar1].m_variance) && (pvVar4[uVar1].m_begin + 1 != pvVar4[uVar1].m_end)) {
      local_1b0 = pTask_pool;
      std::
      priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
      ::pop(node_queue);
      if (pvVar4[uVar1].m_processed == true) {
        if (pvVar4[uVar1].m_unsplittable != false) {
          return true;
        }
        uVar29 = pvVar4[uVar1].m_left;
        pvVar5 = (this->m_nodes).m_p;
        uVar16 = *end_node;
        if (uVar16 != uVar29) {
          lVar20 = 0;
          do {
            pvVar5[uVar16].m_centroid.m_s[lVar20] = pvVar5[uVar29].m_centroid.m_s[lVar20];
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
        }
        *(undefined4 *)((long)&pvVar5[uVar16].m_codebook_index + 3) =
             *(undefined4 *)((long)&pvVar5[uVar29].m_codebook_index + 3);
        uVar23 = pvVar5[uVar29].m_total_weight;
        fVar36 = pvVar5[uVar29].m_variance;
        uVar2 = pvVar5[uVar29].m_begin;
        iVar17 = pvVar5[uVar29].m_left;
        iVar12 = pvVar5[uVar29].m_right;
        iVar13 = pvVar5[uVar29].m_codebook_index;
        pvVar5[uVar16].m_end = pvVar5[uVar29].m_end;
        pvVar5[uVar16].m_left = iVar17;
        pvVar5[uVar16].m_right = iVar12;
        pvVar5[uVar16].m_codebook_index = iVar13;
        pvVar5[uVar16].m_total_weight = uVar23;
        pvVar5[uVar16].m_variance = fVar36;
        pvVar5[uVar16].m_begin = uVar2;
        (this->m_nodes).m_p[*end_node].m_alternative = true;
        local_d8.m_variance = (this->m_nodes).m_p[*end_node].m_variance;
        local_d8.m_index = *end_node;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
        ::push(node_queue,&local_d8);
        uVar2 = *end_node;
        *end_node = uVar2 + 1;
        pvVar4[uVar1].m_left = uVar2;
        uVar29 = pvVar4[uVar1].m_right;
        pvVar5 = (this->m_nodes).m_p;
        uVar16 = *end_node;
        if (uVar16 != uVar29) {
          lVar20 = 0;
          do {
            pvVar5[uVar16].m_centroid.m_s[lVar20] = pvVar5[uVar29].m_centroid.m_s[lVar20];
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
        }
        *(undefined4 *)((long)&pvVar5[uVar16].m_codebook_index + 3) =
             *(undefined4 *)((long)&pvVar5[uVar29].m_codebook_index + 3);
        uVar23 = pvVar5[uVar29].m_total_weight;
        fVar36 = pvVar5[uVar29].m_variance;
        uVar2 = pvVar5[uVar29].m_begin;
        iVar17 = pvVar5[uVar29].m_left;
        iVar12 = pvVar5[uVar29].m_right;
        iVar13 = pvVar5[uVar29].m_codebook_index;
        pvVar5[uVar16].m_end = pvVar5[uVar29].m_end;
        pvVar5[uVar16].m_left = iVar17;
        pvVar5[uVar16].m_right = iVar12;
        pvVar5[uVar16].m_codebook_index = iVar13;
        pvVar5[uVar16].m_total_weight = uVar23;
        pvVar5[uVar16].m_variance = fVar36;
        pvVar5[uVar16].m_begin = uVar2;
        (this->m_nodes).m_p[*end_node].m_alternative = true;
        local_d8.m_variance = (this->m_nodes).m_p[*end_node].m_variance;
        local_d8.m_index = *end_node;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
        ::push(node_queue,&local_d8);
        uVar2 = *end_node;
        *end_node = uVar2 + 1;
        pvVar4[uVar1].m_right = uVar2;
        return true;
      }
      pvVar4[uVar1].m_processed = true;
      uVar29 = 1;
      if ((local_1b0 != (task_pool *)0x0) &&
         (uVar16 = pvVar4[uVar1].m_end - pvVar4[uVar1].m_begin, 0x3ff < uVar16)) {
        uVar16 = uVar16 >> 9;
        uVar29 = local_1b0->m_num_threads + 1;
        if (uVar16 < uVar29) {
          uVar29 = uVar16;
        }
      }
      local_138 = 0;
      uStack_130 = 0;
      local_128 = 0;
      uVar18 = (ulong)pvVar4[uVar1].m_begin;
      if (pvVar4[uVar1].m_begin < pvVar4[uVar1].m_end) {
        fVar36 = -1.0;
        do {
          pvVar6 = this->m_vectors + (this->m_vectorsInfo).m_p[uVar18].index;
          fVar35 = 0.0;
          lVar20 = 0;
          do {
            fVar37 = pvVar6->m_s[lVar20] - pvVar4[uVar1].m_centroid.m_s[lVar20];
            fVar35 = fVar35 + fVar37 * fVar37;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
          if (fVar36 < fVar35) {
            local_128 = *(undefined8 *)(pvVar6->m_s + 4);
            local_138 = *(undefined8 *)pvVar6->m_s;
            uStack_130 = *(undefined8 *)(pvVar6->m_s + 2);
            fVar36 = fVar35;
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != pvVar4[uVar1].m_end);
      }
      uVar18 = (ulong)pvVar4[uVar1].m_begin;
      if (pvVar4[uVar1].m_begin < pvVar4[uVar1].m_end) {
        fVar36 = -1.0;
        do {
          pvVar6 = this->m_vectors + (this->m_vectorsInfo).m_p[uVar18].index;
          fVar35 = 0.0;
          lVar20 = 0;
          do {
            fVar37 = pvVar6->m_s[lVar20] - *(float *)((long)&local_138 + lVar20 * 4);
            fVar35 = fVar35 + fVar37 * fVar37;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
          if (fVar36 < fVar35) {
            local_38 = *(undefined8 *)(pvVar6->m_s + 4);
            local_48 = *(undefined8 *)pvVar6->m_s;
            uStack_40 = *(undefined8 *)(pvVar6->m_s + 2);
            fVar36 = fVar35;
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != pvVar4[uVar1].m_end);
      }
      lVar20 = 0;
      do {
        (&local_d8.m_index)[lVar20] =
             (uint)(pvVar4[uVar1].m_centroid.m_s[lVar20] + *(float *)((long)&local_138 + lVar20 * 4)
                   );
        lVar20 = lVar20 + 1;
      } while (lVar20 != 6);
      lVar20 = 0;
      do {
        afStack_170[lVar20 + -2] = (float)(&local_d8.m_index)[lVar20] * 0.5;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 6);
      lVar20 = 0;
      do {
        (&local_d8.m_index)[lVar20] =
             (uint)(pvVar4[uVar1].m_centroid.m_s[lVar20] + *(float *)((long)&local_48 + lVar20 * 4))
        ;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 6);
      local_118 = end_node;
      local_110 = node_queue;
      lVar20 = 0;
      do {
        *(float *)(local_198 + lVar20 * 4) = (float)(&local_d8.m_index)[lVar20] * 0.5;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 6);
      uVar16 = pvVar4[uVar1].m_begin;
      uVar18 = (ulong)uVar16;
      uVar32 = pvVar4[uVar1].m_end;
      if (uVar16 + 2 < uVar32) {
        pvVar22 = &local_d8;
        memset(pvVar22,0,0x90);
        if (uVar16 < uVar32) {
          pvVar6 = this->m_vectors;
          pVVar7 = (this->m_vectorsInfo).m_p;
          uVar26 = uVar18;
          do {
            uVar24 = pVVar7[uVar26].index;
            lVar20 = 0;
            do {
              *(float *)((long)&local_1f8 + lVar20 * 4) =
                   pvVar6[uVar24].m_s[lVar20] - pvVar4[uVar1].m_centroid.m_s[lVar20];
              lVar20 = lVar20 + 1;
            } while (lVar20 != 6);
            uVar24 = pVVar7[uVar26].weight;
            lVar20 = 0;
            do {
              *(float *)((long)&local_1d8 + lVar20 * 4) =
                   *(float *)((long)&local_1f8 + lVar20 * 4) * (float)uVar24;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 6);
            lVar20 = 0;
            puVar28 = &local_1d8;
            pvVar25 = &local_d8;
            do {
              fVar36 = *(float *)((long)&local_1f8 + lVar20 * 4);
              lVar30 = -6;
              do {
                (&pvVar25[3].m_index)[lVar30] =
                     (uint)(*(float *)((long)puVar28 + lVar30 * 4 + 0x18) * fVar36 +
                           (float)(&pvVar25[3].m_index)[lVar30]);
                lVar30 = lVar30 + 1;
              } while (lVar20 + lVar30 != 0);
              lVar20 = lVar20 + 1;
              pvVar25 = (value_type *)&pvVar25[3].m_variance;
              puVar28 = (undefined8 *)((long)puVar28 + 4);
            } while (lVar20 != 6);
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar32);
        }
        uVar26 = pvVar4[uVar1].m_total_weight;
        lVar20 = 0x90;
        lVar30 = 0;
        do {
          lVar21 = 0;
          pvVar25 = pvVar22;
          do {
            fVar36 = (float)pvVar25->m_index * (1.0 / (float)uVar26);
            pvVar25->m_index = (uint)fVar36;
            *(float *)((long)&pvVar22->m_index + lVar21) = fVar36;
            pvVar25 = (value_type *)&pvVar25->m_variance;
            lVar21 = lVar21 + 0x18;
          } while (lVar20 != lVar21);
          lVar30 = lVar30 + 1;
          pvVar22 = (value_type *)&pvVar22[3].m_variance;
          lVar20 = lVar20 + -0x18;
        } while (lVar30 != 6);
        lVar20 = 0;
        do {
          *(undefined4 *)((long)&local_1f8 + lVar20 * 4) = 0x3f800000;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 6);
        iVar17 = 0;
        do {
          lVar20 = 0;
          pvVar22 = &local_d8;
          fVar36 = 0.0;
          do {
            fVar35 = 0.0;
            lVar30 = 0;
            do {
              fVar35 = fVar35 + (float)(&pvVar22->m_index)[lVar30] *
                                *(float *)((long)&local_1f8 + lVar30 * 4);
              lVar30 = lVar30 + 1;
            } while (lVar30 != 6);
            *(float *)((long)&local_1d8 + lVar20 * 4) = fVar35;
            fVar37 = fVar35;
            if ((lVar20 != 0) && (fVar37 = fVar36, fVar36 <= fVar35)) {
              fVar37 = fVar35;
            }
            lVar20 = lVar20 + 1;
            pvVar22 = pvVar22 + 3;
            fVar36 = fVar37;
          } while (lVar20 != 6);
          if (fVar37 != 0.0) {
            lVar20 = 0;
            do {
              *(float *)((long)&local_1d8 + lVar20 * 4) =
                   *(float *)((long)&local_1d8 + lVar20 * 4) * (1.0 / fVar37);
              lVar20 = lVar20 + 1;
            } while (lVar20 != 6);
          }
          local_1e8[0] = local_1c8[0];
          local_1f8 = local_1d8;
          uVar14 = local_1f8;
          uStack_1f0 = uStack_1d0;
          iVar17 = iVar17 + 1;
        } while (iVar17 != 10);
        local_1f8._0_4_ = (float)local_1d8;
        fVar36 = (float)local_1f8 * (float)local_1f8;
        lVar20 = 1;
        do {
          fVar35 = *(float *)((long)&local_1f8 + lVar20 * 4);
          fVar36 = fVar36 + fVar35 * fVar35;
          lVar20 = lVar20 + 1;
        } while (lVar20 != 6);
        dVar11 = 0.0;
        local_1f8 = uVar14;
        if (fVar36 != 0.0) {
          lVar20 = 0;
          do {
            *(float *)((long)&local_1f8 + lVar20 * 4) =
                 *(float *)((long)&local_1f8 + lVar20 * 4) * (1.0 / SQRT(fVar36));
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
        }
        local_1d8 = 0;
        uStack_1d0 = 0;
        local_1c8[0] = 0;
        local_108[4] = 0.0;
        local_108[5] = 0.0;
        local_108[0] = 0.0;
        local_108[1] = 0.0;
        local_108[2] = 0.0;
        local_108[3] = 0.0;
        auVar39 = ZEXT816(0);
        dVar38 = 0.0;
        if (uVar16 < uVar32) {
          pVVar7 = (this->m_vectorsInfo).m_p;
          pvVar6 = this->m_vectors;
          pvVar8 = (this->m_weightedVectors).m_p;
          dVar11 = 0.0;
          do {
            uVar16 = pVVar7[uVar18].weight;
            uVar24 = pVVar7[uVar18].index;
            lVar20 = 0;
            do {
              local_150[lVar20] = pvVar6[uVar24].m_s[lVar20] - pvVar4[uVar1].m_centroid.m_s[lVar20];
              lVar20 = lVar20 + 1;
            } while (lVar20 != 6);
            fVar36 = local_150[0] * (float)local_1f8;
            lVar20 = 1;
            do {
              fVar36 = fVar36 + *(float *)((long)&local_1f8 + lVar20 * 4) * local_150[lVar20];
              lVar20 = lVar20 + 1;
            } while (lVar20 != 6);
            if (0.0 <= fVar36) {
              lVar20 = 0;
              do {
                local_108[lVar20] = local_108[lVar20] + pvVar8[uVar24].m_s[lVar20];
                lVar20 = lVar20 + 1;
              } while (lVar20 != 6);
              auVar39._0_8_ = auVar39._0_8_ + (double)uVar16;
            }
            else {
              lVar20 = 0;
              do {
                *(float *)((long)&local_1d8 + lVar20 * 4) =
                     *(float *)((long)&local_1d8 + lVar20 * 4) + pvVar8[uVar24].m_s[lVar20];
                lVar20 = lVar20 + 1;
              } while (lVar20 != 6);
              dVar11 = dVar11 + (double)uVar16;
            }
            dVar38 = auVar39._0_8_;
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar32);
        }
        if ((0.0 < dVar11) && (0.0 < dVar38)) {
          lVar20 = 0;
          do {
            local_150[lVar20] = *(float *)((long)&local_1d8 + lVar20 * 4) * (float)(1.0 / dVar11);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
          afStack_170[2] = local_150[4];
          afStack_170[3] = local_150[5];
          local_198._36_4_ = local_150[1];
          local_198._32_4_ = local_150[0];
          afStack_170[0] = local_150[2];
          afStack_170[1] = local_150[3];
          lVar20 = 0;
          do {
            local_150[lVar20] = local_108[lVar20] * (float)(1.0 / dVar38);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
          local_198._16_4_ = local_150[4];
          local_198._20_4_ = local_150[5];
          local_198._4_4_ = local_150[1];
          local_198._0_4_ = local_150[0];
          local_198._8_4_ = local_150[2];
          local_198._12_4_ = local_150[3];
        }
      }
      pvVar31 = &this->m_vectorsInfoRight;
      local_1a8 = &this->m_vectorsInfoLeft;
      local_e8 = ZEXT816(0x501502f9);
      local_1b4 = 0.0;
      iVar17 = 0;
      fVar36 = 0.0;
      local_158 = pvVar31;
      do {
        local_19c = iVar17;
        uVar16 = pvVar4[uVar1].m_begin;
        uVar18 = (ulong)uVar16;
        local_1e8[0]._0_4_ = 0.0;
        local_1e8[0]._4_4_ = 0.0;
        local_1f8._0_4_ = 0.0;
        local_1f8._4_4_ = 0;
        uStack_1f0._0_4_ = 0.0;
        uStack_1f0._4_4_ = 0.0;
        local_1c8[0]._0_4_ = 0.0;
        local_1c8[0]._4_4_ = 0.0;
        local_1d8._0_4_ = 0.0;
        local_1d8._4_4_ = 0.0;
        uStack_1d0._0_4_ = 0.0;
        uStack_1d0._4_4_ = 0.0;
        uVar32 = uVar16;
        if (uVar29 < 2) {
          if (uVar16 < pvVar4[uVar1].m_end) {
            dVar11 = 0.0;
            dVar38 = 0.0;
            uVar26 = 0;
            uVar34 = 0;
            uVar19 = uVar18;
            do {
              pVVar7 = (this->m_vectorsInfo).m_p;
              uVar32 = pVVar7[uVar18].index;
              fVar35 = 0.0;
              lVar20 = 0;
              do {
                fVar37 = afStack_170[lVar20 + -2] - this->m_vectors[uVar32].m_s[lVar20];
                fVar35 = fVar35 + fVar37 * fVar37;
                lVar20 = lVar20 + 1;
              } while (lVar20 != 6);
              fVar37 = 0.0;
              lVar20 = 0;
              do {
                fVar41 = *(float *)(local_198 + lVar20 * 4) - this->m_vectors[uVar32].m_s[lVar20];
                fVar37 = fVar37 + fVar41 * fVar41;
                lVar20 = lVar20 + 1;
              } while (lVar20 != 6);
              if (fVar37 <= fVar35) {
                pvVar6 = (this->m_weightedVectors).m_p;
                lVar20 = 0;
                do {
                  *(float *)((long)&local_1d8 + lVar20 * 4) =
                       *(float *)((long)&local_1d8 + lVar20 * 4) + pvVar6[uVar32].m_s[lVar20];
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 6);
                dVar11 = dVar11 + (this->m_weightedDotProducts).m_p[uVar32];
                uVar26 = uVar26 + pVVar7[uVar18].weight;
                pvVar27 = pvVar31;
                uVar32 = uVar16 + 1;
                uVar24 = uVar16;
              }
              else {
                pvVar6 = (this->m_weightedVectors).m_p;
                lVar20 = 0;
                do {
                  *(float *)((long)&local_1f8 + lVar20 * 4) =
                       *(float *)((long)&local_1f8 + lVar20 * 4) + pvVar6[uVar32].m_s[lVar20];
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 6);
                dVar38 = dVar38 + (this->m_weightedDotProducts).m_p[uVar32];
                uVar34 = uVar34 + pVVar7[uVar18].weight;
                uVar24 = (uint)uVar19;
                uVar19 = (ulong)(uVar24 + 1);
                pvVar27 = local_1a8;
                uVar32 = uVar16;
              }
              uVar16 = uVar32;
              uVar32 = (uint)uVar19;
              pvVar27->m_p[uVar24] = pVVar7[uVar18];
              uVar18 = uVar18 + 1;
            } while (uVar18 < pvVar4[uVar1].m_end);
          }
          else {
            dVar38 = 0.0;
            uVar34 = 0;
            uVar26 = 0;
            dVar11 = 0.0;
          }
        }
        else {
          local_d8 = (value_type)((long)local_198 + 0x20);
          local_d0 = local_198;
          local_c8 = pvVar4[uVar1].m_begin;
          local_c4 = pvVar4[uVar1].m_end;
          uVar23 = 0;
          local_c0 = uVar29;
          do {
            pObj = (executable_task *)crnlib_malloc(0x28);
            pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001c59f0;
            pObj[1]._vptr_executable_task = (_func_int **)this;
            pObj[2]._vptr_executable_task = (_func_int **)distance_comparison_task;
            pObj[3]._vptr_executable_task = (_func_int **)0x0;
            *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
            bVar15 = task_pool::queue_task(local_1b0,pObj,uVar23,&local_d8);
            if (!bVar15) {
              crnlib_free(pObj);
            }
            uVar23 = uVar23 + 1;
          } while (uVar23 < local_c0);
          task_pool::join(local_1b0);
          uVar19 = (ulong)pvVar4[uVar1].m_begin;
          pvVar31 = local_158;
          if (pvVar4[uVar1].m_begin < pvVar4[uVar1].m_end) {
            dVar11 = 0.0;
            dVar38 = 0.0;
            uVar26 = 0;
            uVar34 = 0;
            uVar33 = uVar18;
            do {
              pVVar7 = (this->m_vectorsInfo).m_p;
              uVar16 = pVVar7[uVar19].index;
              if ((this->m_vectorComparison).m_p[uVar19] == true) {
                pvVar6 = (this->m_weightedVectors).m_p;
                lVar20 = 0;
                do {
                  *(float *)((long)&local_1f8 + lVar20 * 4) =
                       *(float *)((long)&local_1f8 + lVar20 * 4) + pvVar6[uVar16].m_s[lVar20];
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 6);
                dVar38 = dVar38 + (this->m_weightedDotProducts).m_p[uVar16];
                uVar34 = uVar34 + pVVar7[uVar19].weight;
                uVar16 = (uint)uVar33;
                uVar33 = (ulong)(uVar16 + 1);
                pvVar27 = local_1a8;
              }
              else {
                pvVar6 = (this->m_weightedVectors).m_p;
                lVar20 = 0;
                do {
                  *(float *)((long)&local_1d8 + lVar20 * 4) =
                       *(float *)((long)&local_1d8 + lVar20 * 4) + pvVar6[uVar16].m_s[lVar20];
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 6);
                dVar11 = dVar11 + (this->m_weightedDotProducts).m_p[uVar16];
                uVar26 = uVar26 + pVVar7[uVar19].weight;
                uVar16 = (uint)uVar18;
                uVar18 = (ulong)(uVar16 + 1);
                pvVar27 = local_158;
              }
              uVar32 = (uint)uVar33;
              pvVar27->m_p[uVar16] = pVVar7[uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar19 < pvVar4[uVar1].m_end);
          }
          else {
            dVar38 = 0.0;
            uVar34 = 0;
            uVar26 = 0;
            dVar11 = 0.0;
          }
        }
        this_00 = local_110;
        if ((uVar34 == 0) || (uVar26 == 0)) {
          pvVar4[uVar1].m_unsplittable = true;
          iVar17 = 1;
        }
        else {
          fVar36 = (float)local_1f8 * (float)local_1f8;
          lVar20 = 1;
          do {
            fVar35 = *(float *)((long)&local_1f8 + lVar20 * 4);
            fVar36 = fVar36 + fVar35 * fVar35;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
          fVar35 = (float)local_1d8 * (float)local_1d8;
          lVar20 = 1;
          do {
            fVar37 = *(float *)((long)&local_1d8 + lVar20 * 4);
            fVar35 = fVar35 + fVar37 * fVar37;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
          dVar11 = dVar11 - (double)(fVar35 / (float)uVar26);
          lVar20 = 0;
          do {
            *(float *)((long)&local_1f8 + lVar20 * 4) =
                 *(float *)((long)&local_1f8 + lVar20 * 4) * (1.0 / (float)uVar34);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
          fVar36 = (float)(dVar38 - (double)(fVar36 / (float)uVar34));
          lVar20 = 0;
          do {
            *(float *)((long)&local_1d8 + lVar20 * 4) =
                 *(float *)((long)&local_1d8 + lVar20 * 4) * (1.0 / (float)uVar26);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
          afStack_170[2] = (float)local_1e8[0];
          afStack_170[3] = local_1e8[0]._4_4_;
          local_198._32_4_ = (float)local_1f8;
          local_198._36_4_ = local_1f8._4_4_;
          afStack_170[0] = (float)uStack_1f0;
          afStack_170[1] = uStack_1f0._4_4_;
          local_198._0_4_ = (float)local_1d8;
          local_198._4_4_ = local_1d8._4_4_;
          local_198._8_4_ = (float)uStack_1d0;
          local_198._12_4_ = uStack_1d0._4_4_;
          local_198._16_4_ = (float)local_1c8[0];
          local_198._20_4_ = local_1c8[0]._4_4_;
          local_1b4 = (float)dVar11;
          fVar35 = local_1b4 + fVar36;
          iVar17 = 0x23;
          if (1e-05 <= fVar35) {
            fVar37 = ((float)local_e8._0_4_ - fVar35) / fVar35;
            uVar16 = -(uint)(fVar37 < 1e-05);
            auVar40._0_4_ = local_e8._0_4_ & uVar16;
            auVar40._4_4_ = local_e8._4_4_;
            auVar40._8_4_ = local_e8._8_4_;
            auVar40._12_4_ = local_e8._12_4_;
            auVar10._4_4_ = ~local_e8._4_4_ & (uint)((ulong)dVar11 >> 0x20);
            auVar10._0_4_ = ~uVar16 & (uint)fVar35;
            auVar10._8_8_ = 0;
            local_e8 = auVar40 | auVar10;
            iVar17 = 0;
            if (fVar37 < 1e-05) {
              iVar17 = 0x23;
            }
          }
        }
        if (iVar17 != 0) goto LAB_0017cddc;
        iVar17 = local_19c + 1;
      } while (iVar17 != 0x400);
      iVar17 = 0x23;
LAB_0017cddc:
      if (iVar17 == 0x23) {
        uVar2 = *local_118;
        *local_118 = uVar2 + 1;
        pvVar4[uVar1].m_left = uVar2;
        uVar2 = *local_118;
        *local_118 = uVar2 + 1;
        pvVar4[uVar1].m_right = uVar2;
        local_d8.m_variance = fVar36;
        local_d8.m_index = pvVar4[uVar1].m_left;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
        ::push(local_110,&local_d8);
        local_d8.m_variance = local_1b4;
        local_d8.m_index = pvVar4[uVar1].m_right;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
        ::push(this_00,&local_d8);
        uVar29 = pvVar4[uVar1].m_left;
        pvVar9 = (this->m_nodes).m_p;
        pvVar5 = pvVar9 + uVar29;
        uVar18 = (ulong)(uint)pvVar4[uVar1].m_right;
        local_1a8 = (vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *)
                    (uVar18 * 0x40);
        local_1b0 = (task_pool *)(pvVar9 + uVar18);
        pvVar9[uVar29].m_begin = pvVar4[uVar1].m_begin;
        pvVar9[uVar18].m_begin = uVar32;
        pvVar9[uVar29].m_end = uVar32;
        pvVar9[uVar18].m_end = pvVar4[uVar1].m_end;
        memcpy((this->m_vectorsInfo).m_p + pvVar9[uVar29].m_begin,
               (this->m_vectorsInfoLeft).m_p + pvVar4[uVar1].m_begin,
               (ulong)(pvVar9[uVar29].m_end - pvVar9[uVar29].m_begin) << 3);
        uVar29 = *(uint *)((long)(&pvVar9->m_centroid + 1) + (long)local_1a8 + 0xc);
        memcpy((this->m_vectorsInfo).m_p + uVar29,
               (this->m_vectorsInfoRight).m_p + pvVar4[uVar1].m_begin,
               (ulong)(*(int *)((long)(&pvVar9->m_centroid + 1) + (long)local_1a8 + 0x10) - uVar29)
               << 3);
        if (pvVar5 != (vq_node *)(local_198 + 0x20)) {
          lVar20 = 0;
          do {
            (pvVar5->m_centroid).m_s[lVar20] = afStack_170[lVar20 + -2];
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
        }
        pvVar5->m_total_weight = uVar34;
        pvVar5->m_variance = fVar36;
        if (local_1b0 != (task_pool *)local_198) {
          lVar20 = 0;
          do {
            ((vec<6U,_float> *)&local_1b0->m_task_stack)->m_s[lVar20] =
                 *(float *)(local_198 + lVar20 * 4);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 6);
        }
        *(ulong *)((long)local_1b0 + 0x18) = uVar26;
        *(float *)((long)local_1b0 + 0x20) = local_1b4;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool split_node(std::priority_queue<NodeInfo>& node_queue, uint& end_node, task_pool* pTask_pool = 0) {
    if (node_queue.empty())
      return false;

    vq_node& parent_node = m_nodes[node_queue.top().m_index];

    if (parent_node.m_alternative)
      parent_node.m_alternative = false;

    if (parent_node.m_variance <= 0.0f || parent_node.m_begin + 1 == parent_node.m_end)
      return false;

    node_queue.pop();

    if (parent_node.m_processed) {
      if (!parent_node.m_unsplittable) {
        m_nodes[end_node] = m_nodes[parent_node.m_left];
        m_nodes[end_node].m_alternative = true;
        node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
        parent_node.m_left = end_node++;
        m_nodes[end_node] = m_nodes[parent_node.m_right];
        m_nodes[end_node].m_alternative = true;
        node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
        parent_node.m_right = end_node++;
      }
      return true;
    }
    parent_node.m_processed = true;

    uint num_blocks = (parent_node.m_end - parent_node.m_begin) >> 9;
    uint num_tasks = num_blocks > 1 && pTask_pool ? math::minimum(num_blocks, pTask_pool->get_num_threads() + 1) : 1;

    VectorType furthest(0);
    double furthest_dist = -1.0f;

    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double dist = v.squared_distance(parent_node.m_centroid);
      if (dist > furthest_dist) {
        furthest_dist = dist;
        furthest = v;
      }
    }

    VectorType opposite;
    double opposite_dist = -1.0f;

    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
      const VectorType& v = m_vectors[m_vectorsInfo[i].index];
      double dist = v.squared_distance(furthest);
      if (dist > opposite_dist) {
        opposite_dist = dist;
        opposite = v;
      }
    }

    VectorType left_child((furthest + parent_node.m_centroid) * .5f);
    VectorType right_child((opposite + parent_node.m_centroid) * .5f);

    if (parent_node.m_begin + 2 < parent_node.m_end) {
      const uint N = VectorType::num_elements;

      matrix<N, N, float> covar;
      covar.clear();

      for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
        const VectorType& v = m_vectors[m_vectorsInfo[i].index] - parent_node.m_centroid;
        const VectorType w = v * (float)m_vectorsInfo[i].weight;
        for (uint x = 0; x < N; x++) {
          for (uint y = x; y < N; y++)
            covar[x][y] = covar[x][y] + v[x] * w[y];
        }
      }

      float divider = (float)parent_node.m_total_weight;
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++) {
          covar[x][y] /= divider;
          covar[y][x] = covar[x][y];
        }
      }

      VectorType axis(1.0f);
      // Starting with an estimate of the principle axis should work better, but doesn't in practice?
      //left_child - right_child);
      //axis.normalize();

      for (uint iter = 0; iter < 10; iter++) {
        VectorType x;

        double max_sum = 0;

        for (uint i = 0; i < N; i++) {
          double sum = 0;

          for (uint j = 0; j < N; j++)
            sum += axis[j] * covar[i][j];

          x[i] = (float)sum;

          max_sum = i ? math::maximum(max_sum, sum) : sum;
        }

        if (max_sum != 0.0f)
          x *= (float)(1.0f / max_sum);

        axis = x;
      }

      axis.normalize();

      VectorType new_left_child(0.0f);
      VectorType new_right_child(0.0f);

      double left_weight = 0.0f;
      double right_weight = 0.0f;

      for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
        const VectorInfo& vectorInfo = m_vectorsInfo[i];
        const float weight = (float)vectorInfo.weight;
        double t = (m_vectors[vectorInfo.index] - parent_node.m_centroid) * axis;
        if (t < 0.0f) {
          new_left_child += m_weightedVectors[vectorInfo.index];
          left_weight += weight;
        } else {
          new_right_child += m_weightedVectors[vectorInfo.index];
          right_weight += weight;
        }
      }

      if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
        left_child = new_left_child * (float)(1.0f / left_weight);
        right_child = new_right_child * (float)(1.0f / right_weight);
      }
    }

    uint64 left_weight = 0;
    uint64 right_weight = 0;

    uint left_info_index = 0;
    uint right_info_index = 0;

    float prev_total_variance = 1e+10f;

    float left_variance = 0.0f;
    float right_variance = 0.0f;

    // FIXME: Excessive upper limit
    const uint cMaxLoops = 1024;
    for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
      left_info_index = right_info_index = parent_node.m_begin;

      VectorType new_left_child(cClear);
      VectorType new_right_child(cClear);

      double left_ttsum = 0.0f;
      double right_ttsum = 0.0f;

      left_weight = 0;
      right_weight = 0;

      if (num_tasks > 1) {
        distance_comparison_task_params params;
        params.left_child = &left_child;
        params.right_child = &right_child;
        params.begin = parent_node.m_begin;
        params.end = parent_node.m_end;
        params.num_tasks = num_tasks;

        for (uint task = 0; task < params.num_tasks; task++)
          pTask_pool->queue_object_task(this, &tree_clusterizer::distance_comparison_task, task, &params);
        pTask_pool->join();

        for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
          const VectorInfo& vectorInfo = m_vectorsInfo[i];
          if (m_vectorComparison[i]) {
            new_left_child += m_weightedVectors[vectorInfo.index];
            left_ttsum += m_weightedDotProducts[vectorInfo.index];
            left_weight += vectorInfo.weight;
            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
          } else {
            new_right_child += m_weightedVectors[vectorInfo.index];
            right_ttsum += m_weightedDotProducts[vectorInfo.index];
            right_weight += vectorInfo.weight;
            m_vectorsInfoRight[right_info_index++] = vectorInfo;
          }
        }
      } else {
        for (uint i = parent_node.m_begin; i < parent_node.m_end; i++) {
          const VectorInfo& vectorInfo = m_vectorsInfo[i];
          double left_dist2 = left_child.squared_distance(m_vectors[vectorInfo.index]);
          double right_dist2 = right_child.squared_distance(m_vectors[vectorInfo.index]);
          if (left_dist2 < right_dist2) {
            new_left_child += m_weightedVectors[vectorInfo.index];
            left_ttsum += m_weightedDotProducts[vectorInfo.index];
            left_weight += vectorInfo.weight;
            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
          } else {
            new_right_child += m_weightedVectors[vectorInfo.index];
            right_ttsum += m_weightedDotProducts[vectorInfo.index];
            right_weight += vectorInfo.weight;
            m_vectorsInfoRight[right_info_index++] = vectorInfo;
          }
        }
      }

      if ((!left_weight) || (!right_weight)) {
        parent_node.m_unsplittable = true;
        return true;
      }

      left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
      right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));

      new_left_child *= (1.0f / left_weight);
      new_right_child *= (1.0f / right_weight);

      left_child = new_left_child;
      right_child = new_right_child;

      float total_variance = left_variance + right_variance;
      if (total_variance < .00001f)
        break;

      if (((prev_total_variance - total_variance) / total_variance) < .00001f)
        break;

      prev_total_variance = total_variance;
    }

    parent_node.m_left = end_node++;
    parent_node.m_right = end_node++;

    node_queue.push(NodeInfo(parent_node.m_left, left_variance));
    node_queue.push(NodeInfo(parent_node.m_right, right_variance));

    vq_node& left_child_node = m_nodes[parent_node.m_left];
    vq_node& right_child_node = m_nodes[parent_node.m_right];

    left_child_node.m_begin = parent_node.m_begin;
    left_child_node.m_end = right_child_node.m_begin = left_info_index;
    right_child_node.m_end = parent_node.m_end;

    memcpy(&m_vectorsInfo[left_child_node.m_begin], &m_vectorsInfoLeft[parent_node.m_begin], (left_child_node.m_end - left_child_node.m_begin) * sizeof(VectorInfo));
    memcpy(&m_vectorsInfo[right_child_node.m_begin], &m_vectorsInfoRight[parent_node.m_begin], (right_child_node.m_end - right_child_node.m_begin) * sizeof(VectorInfo));

    left_child_node.m_centroid = left_child;
    left_child_node.m_total_weight = left_weight;
    left_child_node.m_variance = left_variance;

    right_child_node.m_centroid = right_child;
    right_child_node.m_total_weight = right_weight;
    right_child_node.m_variance = right_variance;

    return true;
  }